

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib554.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    iVar1 = once(URL,true);
    if (iVar1 == 0) {
      iVar1 = once(URL,false);
    }
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    iVar1 = 0x7e;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res = once(URL, TRUE); /* old */
  if(!res)
    res = once(URL, FALSE); /* new */

  curl_global_cleanup();

  return res;
}